

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::OP_InitClassMemberSetComputedName
               (Var object,Var elementName,Var value,ScriptContext *scriptContext,
               PropertyOperationFlags flags)

{
  bool bVar1;
  uint uVar2;
  RecyclableObject *obj;
  
  uVar2 = OP_InitElemSetter(object,elementName,value,scriptContext,flags);
  obj = VarTo<Js::RecyclableObject>(object);
  bVar1 = VarIsImpl<Js::JavascriptFunction>(obj);
  if (uVar2 != 0x124 || !bVar1) {
    (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3e]
    )(obj,(ulong)uVar2,6);
    return;
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ea01,(PCWSTR)0x0);
}

Assistant:

void JavascriptOperators::OP_InitClassMemberSetComputedName(Var object, Var elementName, Var value, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_InitClassMemberSetComputedName);
        Js::PropertyId propertyId = JavascriptOperators::OP_InitElemSetter(object, elementName, value, scriptContext);
        RecyclableObject* instance = VarTo<RecyclableObject>(object);

        // instance will be a function if it is the class constructor (otherwise it would be an object)
        if (VarIs<JavascriptFunction>(instance) && Js::PropertyIds::prototype == propertyId)
        {
            // It is a TypeError to have a static member with a computed name that evaluates to 'prototype'
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassStaticMethodCannotBePrototype);
        }

        instance->SetAttributes(propertyId, PropertyClassMemberDefaults);
        JIT_HELPER_END(Op_InitClassMemberSetComputedName);
    }